

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O0

void JEBDebug::internal::
     write<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (ostream *os,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  bool bVar1;
  ostream *poVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  ostream *local_20;
  ostream *os_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_20 = os;
  os_local = (ostream *)end._M_current;
  end_local = begin;
  bVar1 = __gnu_cxx::operator!=
                    (&end_local,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&os_local)
  ;
  poVar2 = local_20;
  if (bVar1) {
    local_28 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&end_local,0);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_28);
    std::ostream::operator<<(poVar2,*piVar3);
  }
  while (bVar1 = __gnu_cxx::operator!=
                           (&end_local,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &os_local), bVar1) {
    poVar2 = std::operator<<(local_20,", ");
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&end_local);
    std::ostream::operator<<(poVar2,*piVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&end_local,0);
  }
  return;
}

Assistant:

void write(std::ostream& os, It begin, It end)
    {
        if (begin != end)
            os << *begin++;
        for (; begin != end; begin++)
            os << ", " << *begin;
    }